

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

void console_uniforms(bool _show)

{
  bool bVar1;
  bool _show_local;
  
  bVar1 = console_is_init();
  if (bVar1) {
    stt_visible = _show;
    console_sigwinch_handler(0);
  }
  return;
}

Assistant:

void console_uniforms( bool _show ) {
    #if defined(SUPPORT_NCURSES)
    if (!console_is_init())
        return;

    stt_visible = _show;
    console_sigwinch_handler(0);

    #endif
}